

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceNameBufferLimitCase::iterate
          (ResourceNameBufferLimitCase *this)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  Context *this_01;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ProgramSources *sources;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  char *in_RCX;
  char *description;
  long lVar7;
  GLsizei *pGVar8;
  int *value;
  int iVar9;
  bool bVar10;
  allocator<char> local_2f5;
  GLsizei written;
  ResourceNameBufferLimitCase *local_2f0;
  int local_2e4;
  long local_2e0;
  char buffer [26];
  ScopedLogSection section;
  undefined1 local_280 [176];
  pointer local_1d0;
  undefined1 uStack_1c8;
  undefined7 uStack_1c7;
  undefined1 uStack_1c0;
  undefined8 uStack_1bf;
  ShaderProgram program;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2e0 = CONCAT44(extraout_var,iVar3);
  this_01 = (this->super_TestCase).m_context;
  renderCtx = this_01->m_renderCtx;
  local_2f0 = this;
  memset(local_280,0,0xac);
  local_1d0 = (pointer)0x0;
  uStack_1c8 = 0;
  uStack_1c7 = 0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)this_01,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(local_size_x = 1) in;\nuniform highp int u_uniformWithALongName;\nwriteonly buffer OutputBufferBlock { highp int b_output_int; };\nvoid main ()\n{\n\tb_output_int = u_uniformWithALongName;\n}\n"
             ,in_RCX);
  glu::ComputeSource::ComputeSource((ComputeSource *)buffer,(string *)&section);
  sources = glu::ProgramSources::operator<<((ProgramSources *)local_280,(ShaderSource *)buffer);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)(buffer + 8));
  std::__cxx11::string::~string((string *)&section);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  tcu::TestContext::setTestResult
            ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS
             ,"Pass");
  pTVar2 = ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"Program",(allocator<char> *)&written);
  std::__cxx11::string::string<std::allocator<char>>((string *)buffer,"Program",&local_2f5);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_280,(string *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  std::__cxx11::string::~string((string *)local_280);
  glu::operator<<(((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"could not build program",(allocator<char> *)buffer);
    tcu::TestError::TestError(pTVar6,(string *)local_280);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  local_2e4 = (**(code **)(local_2e0 + 0x9a8))
                        (program.m_program.m_program,0x92e1,"u_uniformWithALongName");
  dVar4 = (**(code **)(local_2e0 + 0x800))();
  glu::checkError(dVar4,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x5c6);
  if (local_2e4 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,
               "Uniform u_uniformWithALongName resource index was GL_INVALID_INDEX",
               (allocator<char> *)buffer);
    tcu::TestError::TestError(pTVar6,(string *)local_280);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar7 = 8;
  value = &iterate::querySizes[0].querySize;
  do {
    bVar10 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar10) {
      glu::ShaderProgram::~ShaderProgram(&program);
      return STOP;
    }
    pTVar2 = ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"Query",(allocator<char> *)&written);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buffer,((anon_struct_16_3_277c58ec *)(value + -2))->description,&local_2f5)
    ;
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_280,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
    std::__cxx11::string::~string((string *)local_280);
    iVar3 = *value;
    if (iVar3 == 0) {
      written = -1;
      builtin_strncpy(buffer,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
      local_280._0_8_ = ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
      std::operator<<((ostream *)(local_280 + 8),"Querying uniform name to a buffer of size ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_280,value);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", expecting query to write 0 bytes");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
      iVar9 = 0;
    }
    else {
      iVar9 = iVar3 + -1;
      if (0x15 < iVar9) {
        iVar9 = 0x16;
      }
      written = -1;
      builtin_strncpy(buffer,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
      local_280._0_8_ = ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
      std::operator<<((ostream *)(local_280 + 8),"Querying uniform name to a buffer of size ");
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_280,value);
      this_00 = &pMVar5->m_str;
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                      ", expecting query to write ");
      std::ostream::operator<<(this_00,iVar9);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                      " bytes followed by a null terminator");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
    }
    bVar10 = *(bool *)(value + 1);
    pGVar8 = (GLsizei *)0x0;
    if (bVar10 != false) {
      pGVar8 = &written;
    }
    (**(code **)(local_2e0 + 0x9c0))
              (program.m_program.m_program,0x92e1,local_2e4,iVar3,pGVar8,buffer);
    dVar4 = (**(code **)(local_2e0 + 0x800))();
    glu::checkError(dVar4,"query resource name",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x5fa);
    if ((bVar10 == false) || (written == iVar9)) {
      if (iVar3 != 0) {
        if (buffer[iVar9] == '\0') {
          if (buffer[(long)iVar9 + 1] == 'x') goto LAB_012ec997;
          local_280._0_8_ =
               ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_280 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Error, guard at index ");
          std::ostream::operator<<(poVar1,iVar9 + 1);
          std::operator<<((ostream *)poVar1," was modified, got dec=");
          std::ostream::operator<<(poVar1,(int)buffer[(long)iVar9 + 1]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          description = "Wrote over buffer size";
        }
        else {
          local_280._0_8_ =
               ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_280 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Error, expected null terminator at ");
          std::ostream::operator<<(poVar1,iVar9);
          std::operator<<((ostream *)poVar1,", got dec=");
          std::ostream::operator<<(poVar1,(int)buffer[iVar9]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
          description = "Missing null terminator";
        }
        goto LAB_012ec986;
      }
      if (buffer[0] != 'x') {
        local_280._0_8_ =
             ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_280 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "Error, buffer size was 0 but buffer contents were modified. At index 0 got dec="
                       );
        std::ostream::operator<<(poVar1,(int)buffer[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        description = "Buffer contents were modified";
        goto LAB_012ec986;
      }
    }
    else {
      local_280._0_8_ = ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_280 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Error, expected write length of ");
      std::ostream::operator<<(poVar1,iVar9);
      std::operator<<((ostream *)poVar1,", got ");
      std::ostream::operator<<(poVar1,written);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      description = "Unexpected write lenght";
LAB_012ec986:
      tcu::TestContext::setTestResult
                ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,description);
    }
LAB_012ec997:
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    value = value + 4;
  } while( true );
}

Assistant:

ResourceNameBufferLimitCase::IterateResult ResourceNameBufferLimitCase::iterate (void)
{
	static const char* const computeSource =	"${GLSL_VERSION_DECL}\n"
												"layout(local_size_x = 1) in;\n"
												"uniform highp int u_uniformWithALongName;\n"
												"writeonly buffer OutputBufferBlock { highp int b_output_int; };\n"
												"void main ()\n"
												"{\n"
												"	b_output_int = u_uniformWithALongName;\n"
												"}\n";

	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, computeSource)));
	glw::GLuint					uniformIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		m_testCtx.getLog() << program;
		if (!program.isOk())
			throw tcu::TestError("could not build program");
	}

	uniformIndex = gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_uniformWithALongName");
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (uniformIndex == GL_INVALID_INDEX)
		throw tcu::TestError("Uniform u_uniformWithALongName resource index was GL_INVALID_INDEX");

	// Query with different sized buffers, len("u_uniformWithALongName") == 22

	{
		static const struct
		{
			const char*	description;
			int			querySize;
			bool		returnLength;
		} querySizes[] =
		{
			{ "Query to larger buffer",										24,		true	},
			{ "Query to buffer the same size",								23,		true	},
			{ "Query to one byte too small buffer",							22,		true	},
			{ "Query to one byte buffer",									1,		true	},
			{ "Query to zero sized buffer",									0,		true	},
			{ "Query to one byte too small buffer, null length argument",	22,		false	},
			{ "Query to one byte buffer, null length argument",				1,		false	},
			{ "Query to zero sized buffer, null length argument",			0,		false	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(querySizes); ++ndx)
		{
			const tcu::ScopedLogSection			section				(m_testCtx.getLog(), "Query", querySizes[ndx].description);
			const int							uniformNameLen		= 22;
			const int							expectedWriteLen	= (querySizes[ndx].querySize != 0) ? (de::min(uniformNameLen, (querySizes[ndx].querySize - 1))) : (0);
			char								buffer				[26];
			glw::GLsizei						written				= -1;

			// One byte for guard
			DE_ASSERT((int)sizeof(buffer) > querySizes[ndx].querySize);

			deMemset(buffer, 'x', sizeof(buffer));

			if (querySizes[ndx].querySize)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Querying uniform name to a buffer of size " << querySizes[ndx].querySize
					<< ", expecting query to write " << expectedWriteLen << " bytes followed by a null terminator"
					<< tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Querying uniform name to a buffer of size " << querySizes[ndx].querySize
					<< ", expecting query to write 0 bytes"
					<< tcu::TestLog::EndMessage;

			gl.getProgramResourceName(program.getProgram(), GL_UNIFORM, uniformIndex, querySizes[ndx].querySize, (querySizes[ndx].returnLength) ? (&written) : (DE_NULL), buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query resource name");

			if (querySizes[ndx].returnLength && written != expectedWriteLen)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected write length of " << expectedWriteLen << ", got " << written << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected write lenght");
			}
			else if (querySizes[ndx].querySize != 0 && buffer[expectedWriteLen] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected null terminator at " << expectedWriteLen << ", got dec=" << (int)buffer[expectedWriteLen] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Missing null terminator");
			}
			else if (querySizes[ndx].querySize != 0 && buffer[expectedWriteLen+1] != 'x')
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, guard at index " << (expectedWriteLen+1) << " was modified, got dec=" << (int)buffer[expectedWriteLen+1] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Wrote over buffer size");
			}
			else if (querySizes[ndx].querySize == 0 && buffer[0] != 'x')
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, buffer size was 0 but buffer contents were modified. At index 0 got dec=" << (int)buffer[0] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents were modified");
			}
		}
	}

	return STOP;
}